

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O0

int __thiscall
beagle::cpu::BeagleCPUImpl<double,_2,_0>::calculateRootLogLikelihoods
          (BeagleCPUImpl<double,_2,_0> *this,int *bufferIndices,int *categoryWeightsIndices,
          int *stateFrequenciesIndices,int *cumulativeScaleIndices,int count,
          double *outSumLogLikelihood)

{
  undefined4 *in_RCX;
  int *in_RDX;
  int *in_RSI;
  long *in_RDI;
  int *in_R8;
  int in_R9D;
  double *in_stack_00000008;
  int i;
  int cumulativeScalingFactorIndex;
  int local_3c;
  int local_38;
  int local_4;
  
  if (in_R9D == 1) {
    if ((in_RDI[0xb] & 0x80U) == 0) {
      if ((in_RDI[0xb] & 0x100U) == 0) {
        local_38 = *in_R8;
      }
      else {
        local_38 = *in_RSI - (int)in_RDI[2];
      }
    }
    else {
      local_38 = 0;
    }
    if ((*(byte *)((long)in_RDI + 0x13e) & 1) == 0) {
      if (*in_RDX < 0) {
        local_4 = (**(code **)(*in_RDI + 0x238))(in_RDI,*in_RSI,*in_RCX,local_38,in_stack_00000008);
      }
      else {
        local_4 = (**(code **)(*in_RDI + 0x230))
                            (in_RDI,*in_RSI,*in_RDX,*in_RCX,local_38,in_stack_00000008);
      }
    }
    else {
      (**(code **)(*in_RDI + 0x248))(in_RDI,in_RSI,in_RDX,in_RCX,in_R8,in_RDI[0x2c],in_RDI[0x2d]);
      *in_stack_00000008 = 0.0;
      for (local_3c = 0; local_3c < (int)in_RDI[9]; local_3c = local_3c + 1) {
        *in_stack_00000008 = *(double *)(in_RDI[0x2d] + (long)local_3c * 8) + *in_stack_00000008;
      }
      if ((*in_stack_00000008 != *in_stack_00000008) ||
         (NAN(*in_stack_00000008) || NAN(*in_stack_00000008))) {
        local_4 = -8;
      }
      else {
        local_4 = 0;
      }
    }
  }
  else {
    local_4 = (**(code **)(*in_RDI + 600))(in_RDI,in_RSI,in_RDX,in_RCX,in_R8,in_R9D);
  }
  return local_4;
}

Assistant:

BEAGLE_CPU_TEMPLATE
    int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calculateRootLogLikelihoods(const int *bufferIndices,
                                                                       const int *categoryWeightsIndices,
                                                                       const int *stateFrequenciesIndices,
                                                                       const int *cumulativeScaleIndices,
                                                                       int count,
                                                                       double *outSumLogLikelihood) {

    if (count == 1) {
        // We treat this as a special case so that we don't have convoluted logic
        //      at the end of the loop over patterns
        int cumulativeScalingFactorIndex;
        if (kFlags & BEAGLE_FLAG_SCALING_AUTO) {
            cumulativeScalingFactorIndex = 0;
        } else if (kFlags & BEAGLE_FLAG_SCALING_ALWAYS) {
            cumulativeScalingFactorIndex = bufferIndices[0] - kTipCount;
        } else {
            cumulativeScalingFactorIndex = cumulativeScaleIndices[0];
        }

        if (kAutoRootPartitioningEnabled) {
            calcRootLogLikelihoodsByAutoPartitionAsync(bufferIndices,
                                                       categoryWeightsIndices,
                                                       stateFrequenciesIndices,
                                                       cumulativeScaleIndices,
                                                       gAutoPartitionIndices,
                                                       gAutoPartitionOutSumLogLikelihoods);

            *outSumLogLikelihood = 0.0;

            for (int i = 0; i < kPartitionCount; i++) {
                *outSumLogLikelihood += gAutoPartitionOutSumLogLikelihoods[i];
            }

            if (*outSumLogLikelihood != *outSumLogLikelihood) {
                return BEAGLE_ERROR_FLOATING_POINT;
            } else {
                return BEAGLE_SUCCESS;
            }
        } else {

            if (categoryWeightsIndices[0] >= 0) {
                return calcRootLogLikelihoods(bufferIndices[0], categoryWeightsIndices[0], stateFrequenciesIndices[0],
                                              cumulativeScalingFactorIndex, outSumLogLikelihood);
            } else {
                return calcRootLogLikelihoodsPerCategory(
                        bufferIndices[0], stateFrequenciesIndices[0], cumulativeScalingFactorIndex, outSumLogLikelihood);
            }
        }
    } else {
        return calcRootLogLikelihoodsMulti(bufferIndices, categoryWeightsIndices, stateFrequenciesIndices,
                                           cumulativeScaleIndices, count, outSumLogLikelihood);
    }
}